

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::
emplaceValue<QStyleSheetStyleCaches::Tampered<QPalette>const&>
          (Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *this,
          Tampered<QPalette> *args)

{
  ColorGroup CVar1;
  QPalettePrivate *pQVar2;
  long in_FS_OFFSET;
  Tampered<QPalette> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleSheetStyleCaches::Tampered<QPalette>::Tampered(&local_30,args);
  CVar1 = *(ColorGroup *)(this + 0x10);
  *(ColorGroup *)(this + 0x10) = local_30.oldWidgetValue.currentGroup;
  pQVar2 = *(QPalettePrivate **)(this + 8);
  *(QPalettePrivate **)(this + 8) = local_30.oldWidgetValue.d;
  *(ResolveMask *)(this + 0x18) = local_30.resolveMask;
  local_30.oldWidgetValue.d = pQVar2;
  local_30.oldWidgetValue.currentGroup = CVar1;
  QPalette::~QPalette(&local_30.oldWidgetValue);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }